

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

void __thiscall
slang::ast::Expression::getLongestStaticPrefixes
          (Expression *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,EvalContext *evalContext,Expression *longestStaticPrefix)

{
  bool bVar1;
  EvalContext *evalContext_00;
  StreamingConcatenationExpression *this_00;
  ConversionExpression *this_01;
  EvalContext *in_RCX;
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  *in_RDX;
  Expression *in_RSI;
  Expression *in_RDI;
  ConversionExpression *conv;
  StreamExpression *op_1;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range3;
  StreamingConcatenationExpression *stream;
  Expression *op;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  ConcatenationExpression *concat;
  MemberAccessExpression *access;
  RangeSelectExpression *select_1;
  ElementSelectExpression *select;
  ValueExpressionBase *ve;
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  *in_stack_ffffffffffffff48;
  RangeSelectExpression *in_stack_ffffffffffffff50;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68 [16];
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_68;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_60;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_50;
  ConcatenationExpression *local_48;
  MemberAccessExpression *local_40;
  RangeSelectExpression *local_38;
  ElementSelectExpression *local_30;
  Expression *in_stack_ffffffffffffffd8;
  
  evalContext_00 = (EvalContext *)(ulong)in_RDI->kind;
  switch(evalContext_00) {
  case (EvalContext *)0x0:
  default:
    break;
  case (EvalContext *)0x8:
  case (EvalContext *)0x9:
    as<slang::ast::ValueExpressionBase>(in_RDI);
    ValueExpressionBase::getLongestStaticPrefixesImpl
              (in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._0_8_,
               (Expression *)in_stack_ffffffffffffff60._M_current);
    break;
  case (EvalContext *)0xf:
    local_48 = as<slang::ast::ConcatenationExpression>(in_RDI);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x1259f0f);
    bVar1 = Type::isIntegral((Type *)evalContext_00);
    if (bVar1) {
      local_60 = ConcatenationExpression::operands(local_48);
      local_50 = &local_60;
      local_68._M_current =
           (Expression **)
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)evalContext_00,
                                (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator*(&local_68);
        getLongestStaticPrefixes(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++(&local_68);
      }
    }
    break;
  case (EvalContext *)0x11:
    this_00 = as<slang::ast::StreamingConcatenationExpression>(in_RDI);
    StreamingConcatenationExpression::streams(this_00);
    std::
    span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
    ::begin((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
             *)in_RDI);
    std::
    span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
    ::end((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           *)in_stack_ffffffffffffff48);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                               *)evalContext_00,
                              (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                               *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                   *)&stack0xffffffffffffff60);
      not_null<const_slang::ast::Expression_*>::operator->
                ((not_null<const_slang::ast::Expression_*> *)0x125a037);
      getLongestStaticPrefixes(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff60);
    }
    break;
  case (EvalContext *)0x12:
    local_30 = as<slang::ast::ElementSelectExpression>(in_RDI);
    ElementSelectExpression::getLongestStaticPrefixesImpl
              ((ElementSelectExpression *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               evalContext_00,in_RDI);
    break;
  case (EvalContext *)0x13:
    local_38 = as<slang::ast::RangeSelectExpression>(in_RDI);
    RangeSelectExpression::getLongestStaticPrefixesImpl
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,evalContext_00,in_RDI);
    break;
  case (EvalContext *)0x14:
    local_40 = as<slang::ast::MemberAccessExpression>(in_RDI);
    MemberAccessExpression::getLongestStaticPrefixesImpl
              ((MemberAccessExpression *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               evalContext_00,in_RDI);
    break;
  case (EvalContext *)0x16:
    this_01 = as<slang::ast::ConversionExpression>(in_RDI);
    bVar1 = ConversionExpression::isImplicit(this_01);
    if (bVar1) {
      ConversionExpression::operand(this_01);
      getLongestStaticPrefixes(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void Expression::getLongestStaticPrefixes(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    EvalContext& evalContext, const Expression* longestStaticPrefix) const {

    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue: {
            auto& ve = as<ValueExpressionBase>();
            ve.getLongestStaticPrefixesImpl(results, longestStaticPrefix);
            break;
        }
        case ExpressionKind::ElementSelect: {
            auto& select = as<ElementSelectExpression>();
            select.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::RangeSelect: {
            auto& select = as<RangeSelectExpression>();
            select.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            access.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            if (concat.type->isIntegral()) {
                for (auto op : concat.operands())
                    op->getLongestStaticPrefixes(results, evalContext, nullptr);
            }
            break;
        }
        case ExpressionKind::Streaming: {
            SLANG_ASSERT(!longestStaticPrefix);
            auto& stream = as<StreamingConcatenationExpression>();
            for (auto& op : stream.streams())
                op.operand->getLongestStaticPrefixes(results, evalContext, nullptr);
            break;
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit())
                conv.operand().getLongestStaticPrefixes(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::Invalid:
        default:
            break;
    }
}